

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void FTransform_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  unkuint9 Var46;
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  short sVar67;
  undefined1 auVar63 [16];
  short sVar68;
  undefined1 auVar69 [12];
  short sVar79;
  short sVar80;
  short sVar81;
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  short sVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar84;
  short sVar95;
  short sVar96;
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  short sVar82;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar109;
  
  uVar1 = *(ulong *)src;
  uVar2 = *(undefined8 *)(src + 0x20);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar1;
  auVar72._12_2_ = (short)(uVar1 >> 0x30);
  auVar72._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar1;
  auVar71._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = (short)(uVar1 >> 0x20);
  auVar70._0_8_ = uVar1;
  auVar89._2_8_ = auVar70._8_8_;
  auVar89._0_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar89._10_6_ = 0;
  auVar74._12_4_ = 0;
  auVar74._0_12_ = SUB1612(auVar89 << 0x30,4);
  auVar74 = auVar74 << 0x20;
  uVar3 = *(ulong *)(src + 0x40);
  uVar4 = *(undefined8 *)(src + 0x60);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar3;
  auVar87._12_2_ = (short)(uVar3 >> 0x30);
  auVar87._14_2_ = (short)((ulong)uVar4 >> 0x30);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar3;
  auVar86._10_2_ = (short)((ulong)uVar4 >> 0x20);
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = (short)(uVar3 >> 0x20);
  auVar85._0_8_ = uVar3;
  auVar91._2_8_ = auVar85._8_8_;
  auVar91._0_2_ = (short)((ulong)uVar4 >> 0x10);
  auVar91._10_6_ = 0;
  auVar103._12_4_ = 0;
  auVar103._0_12_ = SUB1612(auVar91 << 0x30,4);
  auVar103 = auVar103 << 0x20;
  uVar5 = *(ulong *)ref;
  uVar6 = *(undefined8 *)(ref + 0x20);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar5;
  auVar60._12_2_ = (short)(uVar5 >> 0x30);
  auVar60._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar5;
  auVar59._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = (short)(uVar5 >> 0x20);
  auVar58._0_8_ = uVar5;
  auVar37._2_8_ = auVar58._8_8_;
  auVar37._0_2_ = (short)((ulong)uVar6 >> 0x10);
  auVar37._10_6_ = 0;
  auVar94._12_4_ = 0;
  auVar94._0_12_ = SUB1612(auVar37 << 0x30,4);
  auVar94 = auVar94 << 0x20;
  uVar7 = *(ulong *)(ref + 0x40);
  uVar8 = *(undefined8 *)(ref + 0x60);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar7;
  auVar101._12_2_ = (short)(uVar7 >> 0x30);
  auVar101._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar7;
  auVar100._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = (short)(uVar7 >> 0x20);
  auVar99._0_8_ = uVar7;
  auVar38._2_8_ = auVar99._8_8_;
  auVar38._0_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar38._10_6_ = 0;
  auVar98._12_4_ = 0;
  auVar98._0_12_ = SUB1612(auVar38 << 0x30,4);
  auVar98 = auVar98 << 0x20;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar74._0_13_;
  auVar12[0xe] = (char)((ulong)uVar2 >> 0x18);
  auVar16[0xc] = (char)((ulong)uVar2 >> 0x10);
  auVar16._0_12_ = auVar74._0_12_;
  auVar16._13_2_ = auVar12._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar74._0_11_;
  auVar20._12_3_ = auVar16._12_3_;
  auVar24[10] = (char)(uVar1 >> 0x18);
  auVar24._0_10_ = auVar74._0_10_;
  auVar24._11_4_ = auVar20._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar74._0_9_;
  auVar28._10_5_ = auVar24._10_5_;
  auVar32[8] = (char)(uVar1 >> 0x10);
  auVar32._0_8_ = auVar74._0_8_;
  auVar32._9_6_ = auVar28._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar32._8_7_;
  Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),(char)((ulong)uVar2 >> 8));
  auVar50._9_6_ = 0;
  auVar50._0_9_ = Var40;
  auVar41._1_10_ = SUB1510(auVar50 << 0x30,5);
  auVar41[0] = (char)uVar2;
  auVar51._11_4_ = 0;
  auVar51._0_11_ = auVar41;
  auVar36[2] = (char)(uVar1 >> 8);
  auVar36._0_2_ = (ushort)uVar1;
  auVar36._3_12_ = SUB1512(auVar51 << 0x20,3);
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar103._0_13_;
  auVar9[0xe] = (char)((ulong)uVar4 >> 0x18);
  auVar13[0xc] = (char)((ulong)uVar4 >> 0x10);
  auVar13._0_12_ = auVar103._0_12_;
  auVar13._13_2_ = auVar9._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar103._0_11_;
  auVar17._12_3_ = auVar13._12_3_;
  auVar21[10] = (char)(uVar3 >> 0x18);
  auVar21._0_10_ = auVar103._0_10_;
  auVar21._11_4_ = auVar17._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar103._0_9_;
  auVar25._10_5_ = auVar21._10_5_;
  auVar29[8] = (char)(uVar3 >> 0x10);
  auVar29._0_8_ = auVar103._0_8_;
  auVar29._9_6_ = auVar25._9_6_;
  auVar42._7_8_ = 0;
  auVar42._0_7_ = auVar29._8_7_;
  Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),(char)((ulong)uVar4 >> 8));
  auVar52._9_6_ = 0;
  auVar52._0_9_ = Var43;
  auVar44._1_10_ = SUB1510(auVar52 << 0x30,5);
  auVar44[0] = (char)uVar4;
  auVar53._11_4_ = 0;
  auVar53._0_11_ = auVar44;
  auVar33[2] = (char)(uVar3 >> 8);
  auVar33._0_2_ = (ushort)uVar3;
  auVar33._3_12_ = SUB1512(auVar53 << 0x20,3);
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar94._0_13_;
  auVar10[0xe] = (char)((ulong)uVar6 >> 0x18);
  auVar14[0xc] = (char)((ulong)uVar6 >> 0x10);
  auVar14._0_12_ = auVar94._0_12_;
  auVar14._13_2_ = auVar10._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar94._0_11_;
  auVar18._12_3_ = auVar14._12_3_;
  auVar22[10] = (char)(uVar5 >> 0x18);
  auVar22._0_10_ = auVar94._0_10_;
  auVar22._11_4_ = auVar18._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar94._0_9_;
  auVar26._10_5_ = auVar22._10_5_;
  auVar30[8] = (char)(uVar5 >> 0x10);
  auVar30._0_8_ = auVar94._0_8_;
  auVar30._9_6_ = auVar26._9_6_;
  auVar45._7_8_ = 0;
  auVar45._0_7_ = auVar30._8_7_;
  Var46 = CONCAT81(SUB158(auVar45 << 0x40,7),(char)((ulong)uVar6 >> 8));
  auVar54._9_6_ = 0;
  auVar54._0_9_ = Var46;
  auVar47._1_10_ = SUB1510(auVar54 << 0x30,5);
  auVar47[0] = (char)uVar6;
  auVar55._11_4_ = 0;
  auVar55._0_11_ = auVar47;
  auVar34[2] = (char)(uVar5 >> 8);
  auVar34._0_2_ = (ushort)uVar5;
  auVar34._3_12_ = SUB1512(auVar55 << 0x20,3);
  sVar68 = ((ushort)uVar1 & 0xff) - ((ushort)uVar5 & 0xff);
  sVar79 = auVar36._2_2_ - auVar34._2_2_;
  sVar80 = auVar41._0_2_ - auVar47._0_2_;
  sVar81 = (short)Var40 - (short)Var46;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar98._0_13_;
  auVar11[0xe] = (char)((ulong)uVar8 >> 0x18);
  auVar15[0xc] = (char)((ulong)uVar8 >> 0x10);
  auVar15._0_12_ = auVar98._0_12_;
  auVar15._13_2_ = auVar11._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar98._0_11_;
  auVar19._12_3_ = auVar15._12_3_;
  auVar23[10] = (char)(uVar7 >> 0x18);
  auVar23._0_10_ = auVar98._0_10_;
  auVar23._11_4_ = auVar19._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar98._0_9_;
  auVar27._10_5_ = auVar23._10_5_;
  auVar31[8] = (char)(uVar7 >> 0x10);
  auVar31._0_8_ = auVar98._0_8_;
  auVar31._9_6_ = auVar27._9_6_;
  auVar48._7_8_ = 0;
  auVar48._0_7_ = auVar31._8_7_;
  Var40 = CONCAT81(SUB158(auVar48 << 0x40,7),(char)((ulong)uVar8 >> 8));
  auVar56._9_6_ = 0;
  auVar56._0_9_ = Var40;
  auVar49._1_10_ = SUB1510(auVar56 << 0x30,5);
  auVar49[0] = (char)uVar8;
  auVar57._11_4_ = 0;
  auVar57._0_11_ = auVar49;
  auVar35[2] = (char)(uVar7 >> 8);
  auVar35._0_2_ = (ushort)uVar7;
  auVar35._3_12_ = SUB1512(auVar57 << 0x20,3);
  auVar88._0_2_ = ((ushort)uVar3 & 0xff) - ((ushort)uVar7 & 0xff);
  auVar88._2_2_ = auVar33._2_2_ - auVar35._2_2_;
  auVar88._4_2_ = auVar44._0_2_ - auVar49._0_2_;
  auVar88._6_2_ = (short)Var43 - (short)Var40;
  auVar88._8_2_ = auVar29._8_2_ - auVar31._8_2_;
  auVar88._10_2_ = auVar21._10_2_ - auVar23._10_2_;
  auVar88._12_2_ = auVar13._12_2_ - auVar15._12_2_;
  auVar88._14_2_ = (auVar9._13_2_ >> 8) - (auVar11._13_2_ >> 8);
  auVar73._2_2_ = auVar88._8_2_;
  auVar73._0_2_ = auVar32._8_2_ - auVar30._8_2_;
  auVar73._4_2_ = auVar24._10_2_ - auVar22._10_2_;
  auVar73._6_2_ = auVar88._10_2_;
  auVar73._8_2_ = auVar16._12_2_ - auVar14._12_2_;
  auVar73._10_2_ = auVar88._12_2_;
  auVar73._12_2_ = (auVar12._13_2_ >> 8) - (auVar10._13_2_ >> 8);
  auVar73._14_2_ = auVar88._14_2_;
  auVar74 = pshuflw(auVar73,auVar73,0xd8);
  auVar74 = pshufhw(auVar74,auVar74,0x27);
  auVar75._0_4_ = auVar74._0_4_;
  auVar75._8_4_ = auVar74._8_4_;
  auVar75._4_4_ = auVar74._12_4_;
  auVar75._12_4_ = auVar74._4_4_;
  auVar74 = pshuflw(auVar75,auVar75,0xe1);
  auVar89 = pshufhw(auVar88,auVar74,0x4b);
  auVar102._0_2_ = sVar68 + auVar89._0_2_;
  auVar102._2_2_ = sVar79 + auVar89._2_2_;
  auVar102._4_2_ = sVar80 + auVar89._4_2_;
  auVar102._6_2_ = sVar81 + auVar89._6_2_;
  auVar102._8_2_ = auVar88._0_2_ + auVar89._8_2_;
  auVar102._10_2_ = auVar88._2_2_ + auVar89._10_2_;
  auVar102._12_2_ = auVar88._4_2_ + auVar89._12_2_;
  auVar102._14_2_ = auVar88._6_2_ + auVar89._14_2_;
  auVar74 = pmaddwd(_DAT_0014eed0,auVar102);
  auVar103 = pmaddwd(auVar102,_DAT_00151910);
  auVar61._0_2_ = sVar68 - auVar89._0_2_;
  auVar61._2_2_ = sVar79 - auVar89._2_2_;
  auVar61._4_2_ = sVar80 - auVar89._4_2_;
  auVar61._6_2_ = sVar81 - auVar89._6_2_;
  auVar61._8_2_ = auVar88._0_2_ - auVar89._8_2_;
  auVar61._10_2_ = auVar88._2_2_ - auVar89._10_2_;
  auVar61._12_2_ = auVar88._4_2_ - auVar89._12_2_;
  auVar61._14_2_ = auVar88._6_2_ - auVar89._14_2_;
  auVar89 = packssdw(auVar74,auVar103);
  auVar103 = pmaddwd(_DAT_00151920,auVar61);
  auVar74 = pmaddwd(auVar61,_DAT_00151930);
  auVar90._0_4_ = auVar103._0_4_ + 0x714 >> 9;
  auVar90._4_4_ = auVar103._4_4_ + 0x714 >> 9;
  auVar90._8_4_ = auVar103._8_4_ + 0x714 >> 9;
  auVar90._12_4_ = auVar103._12_4_ + 0x714 >> 9;
  auVar62._0_4_ = auVar74._0_4_ + 0x3a9 >> 9;
  auVar62._4_4_ = auVar74._4_4_ + 0x3a9 >> 9;
  auVar62._8_4_ = auVar74._8_4_ + 0x3a9 >> 9;
  auVar62._12_4_ = auVar74._12_4_ + 0x3a9 >> 9;
  auVar91 = packssdw(auVar90,auVar62);
  sVar95 = auVar91._6_2_;
  sVar109 = auVar89._6_2_;
  auVar107._0_12_ = auVar89._0_12_;
  auVar107._12_2_ = sVar109;
  auVar107._14_2_ = sVar95;
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._0_10_ = auVar89._0_10_;
  auVar106._10_2_ = auVar91._4_2_;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._0_8_ = auVar89._0_8_;
  auVar105._8_2_ = auVar89._4_2_;
  auVar104._8_8_ = auVar105._8_8_;
  auVar104._6_2_ = auVar91._2_2_;
  auVar104._4_2_ = auVar89._2_2_;
  sVar84 = auVar91._0_2_;
  auVar104._0_2_ = auVar89._0_2_;
  auVar104._2_2_ = sVar84;
  sVar82 = auVar89._8_2_;
  sVar96 = auVar91._8_2_;
  auVar69._0_8_ = CONCAT26(auVar91._10_2_,CONCAT24(auVar89._10_2_,CONCAT22(sVar96,sVar82)));
  auVar69._8_2_ = auVar89._12_2_;
  auVar69._10_2_ = auVar91._12_2_;
  sVar83 = auVar89._14_2_;
  auVar76._12_2_ = sVar83;
  auVar76._0_12_ = auVar69;
  sVar97 = auVar91._14_2_;
  auVar76._14_2_ = sVar97;
  auVar108._8_8_ = auVar69._0_8_;
  auVar108._0_8_ = auVar104._0_8_;
  auVar74 = pshuflw(auVar76,auVar108,0x72);
  auVar74 = pshufhw(auVar74,auVar74,0x72);
  auVar92._4_4_ = auVar105._8_4_;
  auVar92._0_4_ = auVar106._12_4_;
  auVar92._8_4_ = auVar76._12_4_;
  auVar92._12_4_ = auVar69._8_4_;
  auVar103 = pshuflw(auVar92,auVar92,0x72);
  auVar103 = pshufhw(auVar103,auVar103,0x72);
  auVar77._0_2_ = auVar74._0_2_ - auVar103._0_2_;
  auVar77._2_2_ = auVar74._2_2_ - auVar103._2_2_;
  auVar77._4_2_ = auVar74._4_2_ - auVar103._4_2_;
  auVar77._6_2_ = auVar74._6_2_ - auVar103._6_2_;
  auVar77._8_2_ = auVar74._8_2_ - auVar103._8_2_;
  auVar77._10_2_ = auVar74._10_2_ - auVar103._10_2_;
  auVar77._12_2_ = auVar74._12_2_ - auVar103._12_2_;
  auVar77._14_2_ = auVar74._14_2_ - auVar103._14_2_;
  auVar103 = pmaddwd(_DAT_00151960,auVar77);
  auVar74 = pmaddwd(auVar77,_DAT_00151970);
  auVar93._0_4_ = auVar103._0_4_ + 0x12ee0 >> 0x10;
  auVar93._4_4_ = auVar103._4_4_ + 0x12ee0 >> 0x10;
  auVar93._8_4_ = auVar103._8_4_ + 0x12ee0 >> 0x10;
  auVar93._12_4_ = auVar103._12_4_ + 0x12ee0 >> 0x10;
  auVar78._0_4_ = auVar74._0_4_ + 51000 >> 0x10;
  auVar78._4_4_ = auVar74._4_4_ + 51000 >> 0x10;
  auVar78._8_4_ = auVar74._8_4_ + 51000 >> 0x10;
  auVar78._12_4_ = auVar74._12_4_ + 51000 >> 0x10;
  auVar94 = packssdw(auVar93,auVar93);
  auVar103 = packssdw(auVar78,auVar78);
  sVar64 = auVar89._2_2_ + auVar89._4_2_;
  sVar65 = auVar91._2_2_ + auVar91._4_2_;
  sVar66 = auVar89._10_2_ + auVar89._12_2_;
  sVar67 = auVar91._10_2_ + auVar91._12_2_;
  sVar68 = auVar104._0_2_ + sVar109 + 7;
  sVar79 = sVar84 + sVar95 + 7;
  sVar80 = sVar82 + sVar83 + 7;
  sVar81 = sVar96 + sVar97 + 7;
  auVar110._0_2_ = sVar68 + sVar64;
  auVar110._2_2_ = sVar79 + sVar65;
  auVar110._4_2_ = sVar80 + sVar66;
  auVar110._6_2_ = sVar81 + sVar67;
  auVar110._8_2_ = sVar64 + 7 + sVar64;
  auVar110._10_2_ = sVar65 + 7 + sVar65;
  auVar110._12_2_ = sVar66 + 7 + sVar66;
  auVar110._14_2_ = sVar67 + 7 + sVar67;
  auVar63._0_2_ = sVar68 - sVar64;
  auVar63._2_2_ = sVar79 - sVar65;
  auVar63._4_2_ = sVar80 - sVar66;
  auVar63._6_2_ = sVar81 - sVar67;
  auVar63._8_2_ = (sVar64 + 7) - sVar64;
  auVar63._10_2_ = (sVar65 + 7) - sVar65;
  auVar63._12_2_ = (sVar66 + 7) - sVar66;
  auVar63._14_2_ = (sVar67 + 7) - sVar67;
  auVar89 = psraw(auVar110,4);
  auVar74 = psraw(auVar63,4);
  *(long *)out = auVar89._0_8_;
  *(ulong *)(out + 4) =
       CONCAT26(auVar94._6_2_ - (ushort)(sVar96 == sVar97),
                CONCAT24(auVar94._4_2_ - (ushort)(sVar82 == sVar83),
                         CONCAT22(auVar94._2_2_ - (ushort)(sVar84 == sVar95),
                                  auVar94._0_2_ - (ushort)(auVar104._0_2_ == sVar109))));
  *(long *)(out + 8) = auVar74._0_8_;
  *(long *)(out + 0xc) = auVar103._0_8_;
  return;
}

Assistant:

static void FTransform_SSE2(const uint8_t* src, const uint8_t* ref,
                            int16_t* out) {
  const __m128i zero = _mm_setzero_si128();
  // Load src.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  // 00 01 02 03 *
  // 10 11 12 13 *
  // 20 21 22 23 *
  // 30 31 32 33 *
  // Shuffle.
  const __m128i src_0 = _mm_unpacklo_epi16(src0, src1);
  const __m128i src_1 = _mm_unpacklo_epi16(src2, src3);
  // 00 01 10 11 02 03 12 13 * * ...
  // 20 21 30 31 22 22 32 33 * * ...

  // Load ref.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi16(ref0, ref1);
  const __m128i ref_1 = _mm_unpacklo_epi16(ref2, ref3);

  // Convert both to 16 bit.
  const __m128i src_0_16b = _mm_unpacklo_epi8(src_0, zero);
  const __m128i src_1_16b = _mm_unpacklo_epi8(src_1, zero);
  const __m128i ref_0_16b = _mm_unpacklo_epi8(ref_0, zero);
  const __m128i ref_1_16b = _mm_unpacklo_epi8(ref_1, zero);

  // Compute the difference.
  const __m128i row01 = _mm_sub_epi16(src_0_16b, ref_0_16b);
  const __m128i row23 = _mm_sub_epi16(src_1_16b, ref_1_16b);
  __m128i v01, v32;

  // First pass
  FTransformPass1_SSE2(&row01, &row23, &v01, &v32);

  // Second pass
  FTransformPass2_SSE2(&v01, &v32, out);
}